

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

ParsedNumber<long_long> * __thiscall
QtPrivate::toSignedInteger
          (ParsedNumber<long_long> *__return_storage_ptr__,QtPrivate *this,QByteArrayView data,
          int base)

{
  uint uVar1;
  longlong lVar2;
  QByteArrayView num;
  QSimpleParsedNumber<long_long> QVar3;
  
  if (this == (QtPrivate *)0x0) {
    uVar1 = 1;
    lVar2 = 0;
  }
  else {
    num.m_data._4_4_ = 0;
    num._0_12_ = data._0_12_;
    QVar3 = QLocaleData::bytearrayToLongLong((QLocaleData *)this,num,(int)data.m_data);
    uVar1 = (uint)(QVar3.used < 1);
    lVar2 = 0;
    if (0 < QVar3.used) {
      lVar2 = QVar3.result;
    }
  }
  __return_storage_ptr__->m_value = lVar2;
  *(uint *)&__return_storage_ptr__->field_0x8 = uVar1;
  __return_storage_ptr__->m_reserved2 = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto QtPrivate::toSignedInteger(QByteArrayView data, int base) -> ParsedNumber<qlonglong>
{
#if defined(QT_CHECK_RANGE)
    if (base != 0 && (base < 2 || base > 36)) {
        qWarning("QByteArray::toIntegral: Invalid base %d", base);
        base = 10;
    }
#endif
    if (data.isEmpty())
        return {};

    const QSimpleParsedNumber r = QLocaleData::bytearrayToLongLong(data, base);
    if (r.ok())
        return ParsedNumber(r.result);
    return {};
}